

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args;
  DistItemSyntax *pDVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor local_22;
  DeepCloneVisitor local_21;
  DistWeightSyntax *local_20;
  
  args = detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),&local_22,(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x20) == (SyntaxNode *)0x0) {
    local_20 = (DistWeightSyntax *)0x0;
  }
  else {
    local_20 = (DistWeightSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x20),&local_21,(BumpAllocator *)__child_stack);
  }
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DistItemSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::DistWeightSyntax*>
                     ((BumpAllocator *)__child_stack,(ExpressionSyntax *)args,&local_20);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DistItemSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DistItemSyntax>(
        *deepClone<ExpressionSyntax>(*node.range, alloc),
        node.weight ? deepClone(*node.weight, alloc) : nullptr
    );
}